

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsPendulum_dns.c
# Opt level: O2

int f(sunrealtype t,N_Vector yy,N_Vector fy,void *f_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  
  pdVar4 = (double *)N_VGetArrayPointer();
  pdVar5 = (double *)N_VGetArrayPointer(fy);
  dVar1 = pdVar4[1];
  dVar6 = pdVar4[2];
  dVar3 = pdVar4[3];
  dVar2 = *pdVar4;
  *pdVar5 = dVar6;
  pdVar5[1] = dVar3;
  dVar6 = dVar1 * -13.750371636040745 + dVar6 * dVar6 + dVar3 * dVar3;
  pdVar5[2] = -dVar2 * dVar6;
  pdVar5[3] = -13.750371636040745 - dVar6 * dVar1;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector yy, N_Vector fy, void* f_data)
{
  sunrealtype* yydata = NULL; /* yy vector data */
  sunrealtype* fydata = NULL; /* fy vector data */

  sunrealtype x, y;   /* positions  */
  sunrealtype xd, yd; /* velocities */
  sunrealtype tmp;

  /* Get vector array pointers */
  yydata = N_VGetArrayPointer(yy);
  fydata = N_VGetArrayPointer(fy);

  /* Get vector components */
  x  = yydata[0];
  y  = yydata[1];
  xd = yydata[2];
  yd = yydata[3];

  /* Compute tension */
  tmp = xd * xd + yd * yd - GRAV * y;

  /* Compute RHS */
  fydata[0] = xd;
  fydata[1] = yd;
  fydata[2] = -x * tmp;
  fydata[3] = -y * tmp - GRAV;

  return (0);
}